

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

wchar_t history_save_fp(HistoryW *h,size_t nelem,FILE *fp)

{
  int iVar1;
  wchar_t wVar2;
  long lVar3;
  char *__ptr;
  char *__s;
  size_t sVar4;
  char *mbdst;
  ulong __size;
  wchar_t wVar5;
  bool bVar6;
  HistEventW ev;
  
  lVar3 = ftell((FILE *)fp);
  wVar5 = L'\xffffffff';
  if ((lVar3 == 0) && (iVar1 = fputs("_HiStOrY_V2_\n",(FILE *)fp), iVar1 == -1)) {
    return L'\xffffffff';
  }
  __ptr = (char *)malloc(0x400);
  if (__ptr != (char *)0x0) {
    if (nelem != 0xffffffffffffffff) {
      wVar2 = (*h->h_first)(h->h_ref,&ev);
      while (wVar2 != L'\xffffffff') {
        bVar6 = nelem == 0;
        nelem = nelem - 1;
        if (bVar6) goto LAB_0010ae3b;
        wVar2 = (*h->h_next)(h->h_ref,&ev);
      }
    }
    wVar2 = (*h->h_last)(h->h_ref,&ev);
LAB_0010ae3b:
    __size = 0x400;
    wVar5 = L'\0';
    while (wVar2 != L'\xffffffff') {
      __s = ct_encode_string(ev.str,&history_save_fp::conv);
      sVar4 = strlen(__s);
      mbdst = __ptr;
      if (__size <= sVar4 * 4) {
        __size = sVar4 * 4 + 0x401 & 0xfffffffffffffc00;
        mbdst = (char *)realloc(__ptr,__size);
        if (mbdst == (char *)0x0) {
          wVar5 = L'\xffffffff';
          break;
        }
      }
      strvis(mbdst,__s,L'\x1c');
      fprintf((FILE *)fp,"%s\n",mbdst);
      wVar2 = (*h->h_prev)(h->h_ref,&ev);
      wVar5 = wVar5 + L'\x01';
      __ptr = mbdst;
    }
    free(__ptr);
  }
  return wVar5;
}

Assistant:

static int
history_save_fp(TYPE(History) *h, size_t nelem, FILE *fp)
{
	TYPE(HistEvent) ev;
	int i = -1, retval;
	size_t len, max_size;
	char *ptr;
	const char *str;
#ifndef NARROWCHAR
	static ct_buffer_t conv;
#endif

	if (ftell(fp) == 0 && fputs(hist_cookie, fp) == EOF)
		goto done;
	ptr = h_malloc((max_size = 1024) * sizeof(*ptr));
	if (ptr == NULL)
		goto done;
	if (nelem != (size_t)-1) {
		for (retval = HFIRST(h, &ev); retval != -1 && nelem-- > 0;
		    retval = HNEXT(h, &ev))
			continue;
	} else
		retval = -1;

	if (retval == -1)
		retval = HLAST(h, &ev);

	for (i = 0; retval != -1; retval = HPREV(h, &ev), i++) {
		str = ct_encode_string(ev.str, &conv);
		len = strlen(str) * 4 + 1;
		if (len > max_size) {
			char *nptr;
			max_size = (len + 1024) & (size_t)~1023;
			nptr = h_realloc(ptr, max_size * sizeof(*ptr));
			if (nptr == NULL) {
				i = -1;
				goto oomem;
			}
			ptr = nptr;
		}
		(void) strvis(ptr, str, VIS_WHITE);
		(void) fprintf(fp, "%s\n", ptr);
	}
oomem:
	h_free(ptr);
done:
	return i;
}